

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument_factory.hpp
# Opt level: O0

void __thiscall
boost::runtime::argument_factory<unsigned_long,_false,_false>::produce_argument
          (argument_factory<unsigned_long,_false,_false> *this,cstring *source,cstring *param_name,
          arguments_store *store)

{
  bool bVar1;
  basic_cstring<const_char> *in_RDX;
  basic_cstring<const_char> *in_RSI;
  cstring *in_stack_000000f0;
  cstring *in_stack_000000f8;
  value_interpreter<unsigned_long,_false> *in_stack_00000100;
  unsigned_long *in_stack_ffffffffffffffb0;
  cstring *in_stack_ffffffffffffffb8;
  arguments_store *in_stack_ffffffffffffffc0;
  basic_cstring<const_char> local_30 [3];
  
  unit_test::basic_cstring<const_char>::basic_cstring(local_30,in_RDX);
  bVar1 = unit_test::basic_cstring<const_char>::empty((basic_cstring<const_char> *)0x269400);
  if (!bVar1) {
    unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)&stack0xffffffffffffffb8,in_RDX);
    unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)&stack0xffffffffffffffa8,in_RSI);
    value_interpreter<unsigned_long,_false>::interpret
              (in_stack_00000100,in_stack_000000f8,in_stack_000000f0);
  }
  arguments_store::set<unsigned_long>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  return;
}

Assistant:

void        produce_argument( cstring source, cstring param_name, arguments_store& store ) const
    {
        store.set( param_name, source.empty() ? m_optional_value : m_interpreter.interpret( param_name, source ) );
    }